

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdVerifyEcSignature(void *handle,char *sighash,char *pubkey,char *signature)

{
  bool bVar1;
  CfdException *pCVar2;
  int iVar3;
  allocator local_b2;
  allocator local_b1;
  undefined1 local_b0 [32];
  string local_90;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  Pubkey pubkey_obj;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(sighash);
  if (bVar1) {
    local_b0._0_8_ = "cfdcapi_key.cpp";
    local_b0._8_4_ = 0xaf;
    local_b0._16_8_ = "CfdVerifyEcSignature";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_b0,"sighash is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_b0,"Failed to parameter. sighash is null or empty.",
               (allocator *)&local_90);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_b0);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(pubkey);
  if (!bVar1) {
    bVar1 = cfd::capi::IsEmptyString(signature);
    if (!bVar1) {
      std::__cxx11::string::string((string *)local_b0,pubkey,(allocator *)&local_90);
      cfd::core::Pubkey::Pubkey(&pubkey_obj,(string *)local_b0);
      std::__cxx11::string::~string((string *)local_b0);
      std::__cxx11::string::string((string *)local_b0,sighash,&local_b1);
      cfd::core::ByteData256::ByteData256((ByteData256 *)&local_58,(string *)local_b0);
      std::__cxx11::string::string((string *)&local_90,signature,&local_b2);
      cfd::core::ByteData::ByteData((ByteData *)&local_70,&local_90);
      bVar1 = cfd::core::Pubkey::VerifyEcSignature
                        (&pubkey_obj,(ByteData256 *)&local_58,(ByteData *)&local_70);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_58);
      std::__cxx11::string::~string((string *)local_b0);
      iVar3 = 7;
      if (bVar1) {
        iVar3 = 0;
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey_obj);
      return iVar3;
    }
    local_b0._0_8_ = "cfdcapi_key.cpp";
    local_b0._8_4_ = 0xbb;
    local_b0._16_8_ = "CfdVerifyEcSignature";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_b0,"signature is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_b0,"Failed to parameter. signature is null or empty.",
               (allocator *)&local_90);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_b0);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_b0._0_8_ = "cfdcapi_key.cpp";
  local_b0._8_4_ = 0xb5;
  local_b0._16_8_ = "CfdVerifyEcSignature";
  cfd::core::logger::warn<>((CfdSourceLocation *)local_b0,"pubkey is null or empty.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_b0,"Failed to parameter. pubkey is null or empty.",
             (allocator *)&local_90);
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_b0);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdVerifyEcSignature(
    void* handle, const char* sighash, const char* pubkey,
    const char* signature) {
  try {
    cfd::Initialize();
    if (IsEmptyString(sighash)) {
      warn(CFD_LOG_SOURCE, "sighash is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. sighash is null or empty.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }

    Pubkey pubkey_obj(pubkey);
    bool is_verify = pubkey_obj.VerifyEcSignature(
        ByteData256(sighash), ByteData(signature));
    if (!is_verify) {
      return CfdErrorCode::kCfdSignVerificationError;
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}